

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

istream * tinyobj::safeGetline(istream *is,string *t)

{
  int iVar1;
  sentry se;
  
  t->_M_string_length = 0;
  *(t->_M_dataplus)._M_p = '\0';
  std::istream::sentry::sentry((sentry *)&se,is,true);
  if (se == (sentry)0x1) {
    while (iVar1 = std::streambuf::sbumpc(), iVar1 != -1) {
      if (iVar1 == 10) {
        return is;
      }
      if (iVar1 == 0xd) {
        iVar1 = std::streambuf::sgetc();
        if (iVar1 != 10) {
          return is;
        }
        std::streambuf::sbumpc();
        return is;
      }
      std::__cxx11::string::push_back((char)t);
    }
    if (t->_M_string_length == 0) {
      std::ios::setstate((int)*(undefined8 *)(*(long *)is + -0x18) + (int)is);
    }
  }
  return is;
}

Assistant:

static std::istream &safeGetline(std::istream &is, std::string &t) {
  t.clear();

  // The characters in the stream are read one-by-one using a std::streambuf.
  // That is faster than reading them one-by-one using the std::istream.
  // Code that uses streambuf this way must be guarded by a sentry object.
  // The sentry object performs various tasks,
  // such as thread synchronization and updating the stream state.

  std::istream::sentry se(is, true);
  std::streambuf *sb = is.rdbuf();

  if (se) {
    for (;;) {
      int c = sb->sbumpc();
      switch (c) {
        case '\n':
          return is;
        case '\r':
          if (sb->sgetc() == '\n') sb->sbumpc();
          return is;
        case EOF:
          // Also handle the case when the last line has no line ending
          if (t.empty()) is.setstate(std::ios::eofbit);
          return is;
        default:
          t += static_cast<char>(c);
      }
    }
  }

  return is;
}